

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.cpp
# Opt level: O1

int AF_DObject_Destroy(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  long *plVar1;
  PClass *pPVar2;
  PClass *pPVar3;
  undefined4 in_register_00000014;
  undefined8 uVar4;
  char *__assertion;
  bool bVar5;
  undefined1 auVar6 [16];
  
  pPVar2 = DObject::RegistrationInfo.MyClass;
  uVar4 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      plVar1 = (long *)(param->field_0).field_1.a;
      if (plVar1 != (long *)0x0) {
        if (plVar1[1] == 0) {
          auVar6 = (**(code **)*plVar1)(plVar1);
          uVar4 = auVar6._8_8_;
          plVar1[1] = auVar6._0_8_;
        }
        pPVar3 = (PClass *)plVar1[1];
        bVar5 = pPVar3 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar5;
        uVar4 = CONCAT71((int7)((ulong)uVar4 >> 8),bVar5);
        defaultparam = (TArray<VMValue,_VMValue> *)(ulong)(pPVar3 == pPVar2 || bVar5);
        if (pPVar3 != pPVar2 && !bVar5) {
          do {
            pPVar3 = pPVar3->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar3 != (PClass *)0x0);
            if (pPVar3 == pPVar2) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(DObject))";
          goto LAB_003763f1;
        }
      }
      (**(code **)(*plVar1 + 0x20))(plVar1,defaultparam,uVar4,ret);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003763f1:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.cpp"
                ,0x168,"int AF_DObject_Destroy(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(DObject, Destroy)
{
	PARAM_SELF_PROLOGUE(DObject);
	self->Destroy();
	return 0;	
}